

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlReadMemory(char *buffer,int size,char *url,char *encoding,int options)

{
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr input_00;
  undefined8 local_50;
  xmlDocPtr doc;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *url_local;
  int size_local;
  char *buffer_local;
  
  local_50 = (xmlDocPtr)0x0;
  if (size < 0) {
    buffer_local = (char *)0x0;
  }
  else {
    ctxt_00 = xmlNewParserCtxt();
    if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
      buffer_local = (char *)0x0;
    }
    else {
      xmlCtxtUseOptions(ctxt_00,options);
      input_00 = xmlCtxtNewInputFromMemory
                           (ctxt_00,url,buffer,(long)size,encoding,XML_INPUT_BUF_STATIC);
      if (input_00 != (xmlParserInputPtr)0x0) {
        local_50 = xmlCtxtParseDocument(ctxt_00,input_00);
      }
      xmlFreeParserCtxt(ctxt_00);
      buffer_local = (char *)local_50;
    }
  }
  return (xmlDocPtr)buffer_local;
}

Assistant:

xmlDocPtr
xmlReadMemory(const char *buffer, int size, const char *url,
              const char *encoding, int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlDocPtr doc = NULL;

    if (size < 0)
	return(NULL);

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
        return(NULL);

    xmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromMemory(ctxt, url, buffer, size, encoding,
                                      XML_INPUT_BUF_STATIC);

    if (input != NULL)
        doc = xmlCtxtParseDocument(ctxt, input);

    xmlFreeParserCtxt(ctxt);
    return(doc);
}